

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O2

void sznet::net::defaultKcpConnectionCallback(KcpConnectionPtr *conn)

{
  self *psVar1;
  char *str;
  SourceFile file;
  Logger local_1070;
  undefined1 local_a0 [12];
  InetAddress local_90;
  InetAddress local_74;
  string local_58;
  string local_38;
  
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_a0,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_a0._0_8_;
    file.m_size = local_a0._8_4_;
    Logger::Logger(&local_1070,file,0x10,TRACE,"defaultKcpConnectionCallback");
    KcpConnection::localAddress
              (&local_90,
               (conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    InetAddress::toIpPort_abi_cxx11_(&local_58,&local_90);
    psVar1 = LogStream::operator<<(&local_1070.m_impl.m_stream,&local_58);
    psVar1 = LogStream::operator<<(psVar1," -> ");
    KcpConnection::peerAddress
              (&local_74,
               (conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    InetAddress::toIpPort_abi_cxx11_(&local_38,&local_74);
    psVar1 = LogStream::operator<<(psVar1,&local_38);
    psVar1 = LogStream::operator<<(psVar1," is ");
    str = "DOWN";
    if (((conn->super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        m_state == kConnected) {
      str = "UP";
    }
    LogStream::operator<<(psVar1,str);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    Logger::~Logger(&local_1070);
  }
  return;
}

Assistant:

void defaultKcpConnectionCallback(const KcpConnectionPtr& conn)
{
	LOG_TRACE << conn->localAddress().toIpPort() << " -> "
		<< conn->peerAddress().toIpPort() << " is "
		<< (conn->connected() ? "UP" : "DOWN");
	// do not call conn->forceClose(), because some users want to register message callback only.
}